

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_>::HDivDirectionsMaster
          (TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_> *this,
          TPZFMatrix<double> *directions)

{
  double *pdVar1;
  int i;
  long row;
  double local_108;
  TPZFNMatrix<9,_double> gradx;
  
  local_108 = 0.0;
  TPZFNMatrix<9,_double>::TPZFNMatrix(&gradx,3,2,&local_108);
  for (row = 0; row != 2; row = row + 1) {
    pdVar1 = TPZFMatrix<double>::operator()(&gradx.super_TPZFMatrix<double>,row,row);
    *pdVar1 = 1.0;
  }
  pztopology::TPZQuadrilateral::ComputeHDivDirections<double>
            (&gradx.super_TPZFMatrix<double>,directions);
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&gradx);
  return;
}

Assistant:

void TPZGeoElRefLess<TGeo>::HDivDirectionsMaster(TPZFMatrix<REAL> &directions)
{
    TPZFNMatrix<9,REAL> gradx(3,TGeo::Dimension,0.);
    for (int i = 0; i < TGeo::Dimension; i++) {
        gradx(i,i) = 1.;
    }
    TGeo::ComputeHDivDirections(gradx, directions);
}